

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result_reporter.hpp
# Opt level: O3

void iutest::detail::DefaultGlobalTestPartResultReporter::DefaultReportTestPartResult
               (TestPartResult *test_part_result)

{
  TestInfo *pTVar1;
  pointer ppTVar2;
  Variable *pVVar3;
  TestResult *this;
  pointer ppTVar4;
  string local_38;
  
  if (((Test::Observer<void>::s_current == (Test *)0x0) ||
      (Test::Observer<void>::s_current->m_test_info == (iuITestInfoMediator *)0x0)) ||
     (pTVar1 = Test::Observer<void>::s_current->m_test_info->m_test_info, pTVar1 == (TestInfo *)0x0)
     ) {
    if (UnitTestImpl::ptr()::ptr == 0) {
      iuCodeMessage::make_newline_message_abi_cxx11_
                (&local_38,&test_part_result->super_iuCodeMessage);
      iuConsole::output("%s",local_38._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0011830a;
    }
    if (*(long *)(UnitTestImpl::ptr()::ptr + 0x10) == 0) {
      this = (TestResult *)(UnitTestImpl::ptr()::ptr + 0x38);
    }
    else {
      this = (TestResult *)(*(long *)(UnitTestImpl::ptr()::ptr + 0x10) + 0x78);
    }
  }
  else {
    this = &pTVar1->m_test_result;
  }
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::push_back
            (&this->m_test_part_results,test_part_result);
LAB_0011830a:
  pVVar3 = TestEnv::get_vars();
  ppTVar2 = (pVVar3->m_event_listeners).m_repeater.m_listeners.
            super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar4 = (pVVar3->m_event_listeners).m_repeater.m_listeners.
                 super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar4 != ppTVar2;
      ppTVar4 = ppTVar4 + 1) {
    (*(*ppTVar4)->_vptr_TestEventListener[9])(*ppTVar4,test_part_result);
  }
  return;
}

Assistant:

static void DefaultReportTestPartResult(const TestPartResult& test_part_result)
    {
        TestResult* result = UnitTestImpl::current_test_result();
        if( result )
        {
            result->AddTestPartResult(test_part_result);
        }
        else
        {
            iuConsole::output("%s", test_part_result.make_newline_message().c_str());
        }
        TestEnv::event_listeners().OnTestPartResult(test_part_result);
    }